

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O0

int Res_WinCollectLeavesAndNodes(Res_Win_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *p_00;
  void *pvVar3;
  int local_3c;
  int local_38;
  int m;
  int k;
  int i;
  Abc_Obj_t *pTemp;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vFront;
  Res_Win_t *p_local;
  
  if (p->nWinTfiMax < 1) {
    __assert_fail("p->nWinTfiMax > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                  ,0x6a,"int Res_WinCollectLeavesAndNodes(Res_Win_t *)");
  }
  iVar1 = Vec_VecSize(p->vMatrix);
  if (p->nWinTfiMax < iVar1) {
    Vec_VecClear(p->vMatrix);
    Vec_VecPush(p->vMatrix,0,p->pNode);
    Abc_NtkIncrementTravId(p->pNode->pNtk);
    Abc_NodeSetTravIdCurrent(p->pNode);
    Vec_PtrClear(p->vLeaves);
    for (m = 0; m < p->nWinTfiMax + 1; m = m + 1) {
      pVVar2 = Vec_VecEntry(p->vMatrix,m);
      for (local_38 = 0; iVar1 = Vec_PtrSize(pVVar2), local_38 < iVar1; local_38 = local_38 + 1) {
        pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(pVVar2,local_38);
        for (local_3c = 0; iVar1 = Abc_ObjFaninNum(pObj_00), local_3c < iVar1;
            local_3c = local_3c + 1) {
          p_00 = Abc_ObjFanin(pObj_00,local_3c);
          iVar1 = Abc_NodeIsTravIdCurrent(p_00);
          if (iVar1 == 0) {
            Abc_NodeSetTravIdCurrent(p_00);
            iVar1 = Abc_ObjIsCi(p_00);
            if ((iVar1 == 0) &&
               ((int)((*(uint *)&p->pNode->field_0x14 >> 0xc) - (*(uint *)&p_00->field_0x14 >> 0xc))
                <= p->nWinTfiMax)) {
              Vec_VecPush(p->vMatrix,
                          (*(uint *)&p->pNode->field_0x14 >> 0xc) -
                          (*(uint *)&p_00->field_0x14 >> 0xc),p_00);
            }
            else {
              Vec_PtrPush(p->vLeaves,p_00);
            }
          }
        }
      }
    }
    iVar1 = Vec_PtrSize(p->vLeaves);
    if (iVar1 == 0) {
      p_local._4_4_ = 0;
    }
    else {
      Vec_PtrClear(p->vNodes);
      for (m = p->nWinTfiMax; -1 < m; m = m + -1) {
        pVVar2 = Vec_VecEntry(p->vMatrix,m);
        for (local_38 = 0; iVar1 = Vec_PtrSize(pVVar2), local_38 < iVar1; local_38 = local_38 + 1) {
          pvVar3 = Vec_PtrEntry(pVVar2,local_38);
          Vec_PtrPush(p->vNodes,pvVar3);
        }
        Vec_PtrClear(pVVar2);
      }
      p->nLevLeafMin = 1000000000;
      for (local_38 = 0; iVar1 = Vec_PtrSize(p->vLeaves), local_38 < iVar1; local_38 = local_38 + 1)
      {
        pvVar3 = Vec_PtrEntry(p->vLeaves,local_38);
        iVar1 = Abc_MinInt(p->nLevLeafMin,*(uint *)((long)pvVar3 + 0x14) >> 0xc);
        p->nLevLeafMin = iVar1;
      }
      iVar1 = Abc_MaxInt(((*(uint *)&p->pNode->field_0x14 >> 0xc) - p->nWinTfiMax) - p->nLevTfiMinus
                         ,p->nLevLeafMin);
      p->nLevTravMin = iVar1;
      if (p->nLevTravMin < 0) {
        __assert_fail("p->nLevTravMin >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                      ,0x98,"int Res_WinCollectLeavesAndNodes(Res_Win_t *)");
      }
      p_local._4_4_ = 1;
    }
    return p_local._4_4_;
  }
  __assert_fail("Vec_VecSize(p->vMatrix) > p->nWinTfiMax",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                ,0x6b,"int Res_WinCollectLeavesAndNodes(Res_Win_t *)");
}

Assistant:

int Res_WinCollectLeavesAndNodes( Res_Win_t * p )
{
    Vec_Ptr_t * vFront;
    Abc_Obj_t * pObj, * pTemp;
    int i, k, m;

    assert( p->nWinTfiMax > 0 );
    assert( Vec_VecSize(p->vMatrix) > p->nWinTfiMax );

    // start matrix with the node
    Vec_VecClear( p->vMatrix );
    Vec_VecPush( p->vMatrix, 0, p->pNode );
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Abc_NodeSetTravIdCurrent( p->pNode );

    // collect the leaves (nodes pTemp such that "p->pNode->Level - pTemp->Level > p->nWinTfiMax")
    Vec_PtrClear( p->vLeaves );
    Vec_VecForEachLevelStartStop( p->vMatrix, vFront, i, 0, p->nWinTfiMax+1 )
    {
        Vec_PtrForEachEntry( Abc_Obj_t *, vFront, pObj, k )
        {
            Abc_ObjForEachFanin( pObj, pTemp, m )
            {
                if ( Abc_NodeIsTravIdCurrent( pTemp ) )
                    continue;
                Abc_NodeSetTravIdCurrent( pTemp );
                if ( Abc_ObjIsCi(pTemp) || (int)(p->pNode->Level - pTemp->Level) > p->nWinTfiMax )                    
                    Vec_PtrPush( p->vLeaves, pTemp );
                else
                    Vec_VecPush( p->vMatrix, p->pNode->Level - pTemp->Level, pTemp );
            }
        }
    }
    if ( Vec_PtrSize(p->vLeaves) == 0 )
        return 0;

    // collect the nodes in the reverse order
    Vec_PtrClear( p->vNodes );
    Vec_VecForEachLevelReverseStartStop( p->vMatrix, vFront, i, p->nWinTfiMax+1, 0 )
    {
        Vec_PtrForEachEntry( Abc_Obj_t *, vFront, pObj, k )
            Vec_PtrPush( p->vNodes, pObj );
        Vec_PtrClear( vFront );
    }

    // get the lowest leaf level
    p->nLevLeafMin = ABC_INFINITY;
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, k )
        p->nLevLeafMin = Abc_MinInt( p->nLevLeafMin, (int)pObj->Level );

    // set minimum traversal level
    p->nLevTravMin = Abc_MaxInt( ((int)p->pNode->Level) - p->nWinTfiMax - p->nLevTfiMinus, p->nLevLeafMin );
    assert( p->nLevTravMin >= 0 );
    return 1;
}